

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_assertion_tests.cpp
# Opt level: O2

void __thiscall
test::string_assertion_test::iu_StrTest_x_iutest_x_EqRaw_Test<char>::Body
          (iu_StrTest_x_iutest_x_EqRaw_Test<char> *this)

{
  char *val1;
  type **in_stack_fffffffffffffe08;
  AssertionResult iutest_ar;
  iuCodeMessage local_1c8;
  Fixed local_198;
  
  val1 = text<char>::test;
  iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
            (&iutest_ar,(internal *)"TestFixture::Text::test","p",text<char>::test,text<char>::test,
             (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffe08);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x65,iutest_ar.m_message._M_dataplus._M_p);
    local_1c8._44_4_ = 0xffffffff;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_198);
    std::__cxx11::string::~string((string *)&local_1c8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
            (&iutest_ar,(internal *)"TestFixture::Text::test","p",text<char>::test,val1,
             (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffe08);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x66,iutest_ar.m_message._M_dataplus._M_p);
    local_1c8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_198);
    std::__cxx11::string::~string((string *)&local_1c8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
            (&iutest_ar,(internal *)"TestFixture::Text::test","p",text<char>::test,val1,
             (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffe08);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0x67,iutest_ar.m_message._M_dataplus._M_p);
    local_1c8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_198);
    std::__cxx11::string::~string((string *)&local_1c8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StrTest, EqRaw)
{
    const TypeParam* p = TestFixture::Text::test;
    IUTEST_INFORM_STREQ(TestFixture::Text::test, p);
    IUTEST_EXPECT_STREQ(TestFixture::Text::test, p);
    IUTEST_ASSERT_STREQ(TestFixture::Text::test, p);
}